

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O2

Image * Image_Function_Helper::LookupTable
                  (Image *__return_storage_ptr__,LookupTableForm4 lookupTable,Image *in,
                  vector<unsigned_char,_std::allocator<unsigned_char>_> *table)

{
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>(in);
  PenguinV_Image::ImageTemplate<unsigned_char>::generate
            (__return_storage_ptr__,in,in->_width,in->_height,'\x01','\x01');
  (*lookupTable)(in,0,0,__return_storage_ptr__,0,0,__return_storage_ptr__->_width,
                 __return_storage_ptr__->_height,table);
  return __return_storage_ptr__;
}

Assistant:

Image LookupTable( FunctionTable::LookupTableForm4 lookupTable,
                       const Image & in, const std::vector < uint8_t > & table )
    {
        Image_Function::ParameterValidation( in );

        Image out = in.generate( in.width(), in.height() );

        lookupTable( in, 0, 0, out, 0, 0, out.width(), out.height(), table );

        return out;
    }